

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

AInventory * __thiscall AActor::GiveInventoryType(AActor *this,PClassActor *type)

{
  bool bVar1;
  AInventory *this_00;
  
  if (type != (PClassActor *)0x0) {
    this_00 = (AInventory *)Spawn(type);
    bVar1 = AInventory::CallTryPickup(this_00,this,(AActor **)0x0);
    if (bVar1) {
      return this_00;
    }
    (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this_00);
  }
  return (AInventory *)0x0;
}

Assistant:

AInventory *AActor::GiveInventoryType (PClassActor *type)
{
	AInventory *item = NULL;

	if (type != NULL)
	{
		item = static_cast<AInventory *>(Spawn (type));
		if (!item->CallTryPickup (this))
		{
			item->Destroy ();
			return NULL;
		}
	}
	return item;
}